

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  vfloat<4> vVar3;
  BVH *bvh;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  NodeRef root;
  size_t sVar28;
  size_t sVar29;
  uint uVar30;
  ulong uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef *pNVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar40;
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  float fVar64;
  float fVar65;
  vint4 bi;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 bi_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar79;
  float fVar80;
  vint4 bi_3;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar81;
  uint uVar86;
  uint uVar87;
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar88;
  undefined1 auVar85 [16];
  float fVar94;
  float fVar95;
  vint4 ai;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar103;
  float fVar104;
  vint4 ai_1;
  undefined1 auVar101 [16];
  float fVar105;
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  float fVar121;
  float fVar122;
  vint4 ai_3;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3708 [8];
  float fStack_3700;
  float fStack_36fc;
  undefined1 local_36f8 [8];
  float fStack_36f0;
  float fStack_36ec;
  undefined1 local_36e8 [8];
  float fStack_36e0;
  float fStack_36dc;
  float local_36a8;
  float fStack_36a4;
  float fStack_36a0;
  float fStack_369c;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float local_3688;
  float fStack_3684;
  float fStack_3680;
  float fStack_367c;
  float local_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float local_3668;
  float fStack_3664;
  float fStack_3660;
  float fStack_365c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar47 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar68 = vpcmpeqd_avx(auVar47,(undefined1  [16])valid_i->field_0);
    auVar60 = ZEXT816(0) << 0x40;
    auVar4 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60,5);
    auVar76 = auVar68 & auVar4;
    if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar76[0xf] < '\0')
    {
      auVar4 = vandps_avx(auVar4,auVar68);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar106._8_4_ = 0x7fffffff;
      auVar106._0_8_ = 0x7fffffff7fffffff;
      auVar106._12_4_ = 0x7fffffff;
      auVar68 = vandps_avx(auVar106,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar97._8_4_ = 0x219392ef;
      auVar97._0_8_ = 0x219392ef219392ef;
      auVar97._12_4_ = 0x219392ef;
      auVar68 = vcmpps_avx(auVar68,auVar97,1);
      auVar76 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar97,auVar68);
      auVar68 = vandps_avx(auVar106,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar68 = vcmpps_avx(auVar68,auVar97,1);
      auVar82 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar97,auVar68);
      auVar68 = vandps_avx(auVar106,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar68 = vcmpps_avx(auVar68,auVar97,1);
      auVar68 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar97,auVar68);
      auVar75 = vrcpps_avx(auVar76);
      fVar5 = auVar75._0_4_;
      auVar67._0_4_ = auVar76._0_4_ * fVar5;
      fVar7 = auVar75._4_4_;
      auVar67._4_4_ = auVar76._4_4_ * fVar7;
      fVar9 = auVar75._8_4_;
      auVar67._8_4_ = auVar76._8_4_ * fVar9;
      fVar11 = auVar75._12_4_;
      auVar67._12_4_ = auVar76._12_4_ * fVar11;
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar98,auVar67);
      tray.rdir.field_0._0_4_ = fVar5 + fVar5 * auVar76._0_4_;
      tray.rdir.field_0._4_4_ = fVar7 + fVar7 * auVar76._4_4_;
      tray.rdir.field_0._8_4_ = fVar9 + fVar9 * auVar76._8_4_;
      tray.rdir.field_0._12_4_ = fVar11 + fVar11 * auVar76._12_4_;
      auVar76 = vrcpps_avx(auVar82);
      fVar5 = auVar76._0_4_;
      auVar75._0_4_ = auVar82._0_4_ * fVar5;
      fVar7 = auVar76._4_4_;
      auVar75._4_4_ = auVar82._4_4_ * fVar7;
      fVar9 = auVar76._8_4_;
      auVar75._8_4_ = auVar82._8_4_ * fVar9;
      fVar11 = auVar76._12_4_;
      auVar75._12_4_ = auVar82._12_4_ * fVar11;
      auVar76 = vsubps_avx(auVar98,auVar75);
      tray.rdir.field_0._16_4_ = fVar5 + fVar5 * auVar76._0_4_;
      tray.rdir.field_0._20_4_ = fVar7 + fVar7 * auVar76._4_4_;
      tray.rdir.field_0._24_4_ = fVar9 + fVar9 * auVar76._8_4_;
      tray.rdir.field_0._28_4_ = fVar11 + fVar11 * auVar76._12_4_;
      auVar76 = vrcpps_avx(auVar68);
      fVar5 = auVar76._0_4_;
      auVar82._0_4_ = auVar68._0_4_ * fVar5;
      fVar7 = auVar76._4_4_;
      auVar82._4_4_ = auVar68._4_4_ * fVar7;
      fVar9 = auVar76._8_4_;
      auVar82._8_4_ = auVar68._8_4_ * fVar9;
      fVar11 = auVar76._12_4_;
      auVar82._12_4_ = auVar68._12_4_ * fVar11;
      auVar68 = vsubps_avx(auVar98,auVar82);
      tray.rdir.field_0._32_4_ = fVar5 + fVar5 * auVar68._0_4_;
      tray.rdir.field_0._36_4_ = fVar7 + fVar7 * auVar68._4_4_;
      tray.rdir.field_0._40_4_ = fVar9 + fVar9 * auVar68._8_4_;
      tray.rdir.field_0._44_4_ = fVar11 + fVar11 * auVar68._12_4_;
      auVar68 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar60,1);
      auVar89._8_4_ = 0x20;
      auVar89._0_8_ = 0x2000000020;
      auVar89._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar68,auVar89);
      auVar68 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar60,5);
      auVar76._8_4_ = 0x40;
      auVar76._0_8_ = 0x4000000040;
      auVar76._12_4_ = 0x40;
      auVar90._8_4_ = 0x60;
      auVar90._0_8_ = 0x6000000060;
      auVar90._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar90,auVar76,auVar68);
      auVar68 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar60,5);
      auVar83._8_4_ = 0x80;
      auVar83._0_8_ = 0x8000000080;
      auVar83._12_4_ = 0x80;
      auVar91._8_4_ = 0xa0;
      auVar91._0_8_ = 0xa0000000a0;
      auVar91._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar91,auVar83,auVar68);
      auVar68 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar60);
      auVar76 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar127 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar68,auVar4);
      auVar68._8_4_ = 0xff800000;
      auVar68._0_8_ = 0xff800000ff800000;
      auVar68._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar68,auVar76,auVar4);
      terminated.field_0.i[1] = auVar4._4_4_ ^ auVar47._4_4_;
      terminated.field_0.i[0] = auVar4._0_4_ ^ auVar47._0_4_;
      terminated.field_0.i[2] = auVar4._8_4_ ^ auVar47._8_4_;
      terminated.field_0.i[3] = auVar4._12_4_ ^ auVar47._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar47 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
      auVar129 = ZEXT1664(auVar47);
LAB_003d1ee2:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_003d2933;
          pNVar33 = pNVar33 + -1;
          paVar32 = paVar32 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar57 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar47 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar21 = vmovmskps_avx(auVar47);
        } while (uVar21 == 0);
        uVar25 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar30 < uVar21) {
LAB_003d1f20:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003d2933;
              auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar57._0_16_,6);
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar47[0xf]) goto LAB_003d1ee2;
              uVar25 = (ulong)((uint)root.ptr & 0xf);
              aVar40 = terminated.field_0;
              if (uVar25 == 8) goto LAB_003d2808;
              auVar60._0_4_ = auVar129._0_4_ ^ terminated.field_0._0_4_;
              auVar60._4_4_ = auVar129._4_4_ ^ terminated.field_0._4_4_;
              auVar60._8_4_ = auVar129._8_4_ ^ terminated.field_0._8_4_;
              auVar60._12_4_ = auVar129._12_4_ ^ terminated.field_0._12_4_;
              lVar26 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar24 = 0;
              goto LAB_003d21a8;
            }
            lVar26 = 0;
            sVar29 = 8;
            auVar47 = auVar127._0_16_;
            do {
              sVar28 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar26 * 8);
              if (sVar28 == 8) {
                auVar57 = ZEXT1664(auVar47);
                sVar28 = sVar29;
                break;
              }
              uVar22 = *(undefined4 *)(root.ptr + 0x40 + lVar26 * 4);
              auVar41._4_4_ = uVar22;
              auVar41._0_4_ = uVar22;
              auVar41._8_4_ = uVar22;
              auVar41._12_4_ = uVar22;
              auVar15._8_8_ = tray.org.field_0._8_8_;
              auVar15._0_8_ = tray.org.field_0._0_8_;
              auVar16._8_8_ = tray.org.field_0._24_8_;
              auVar16._0_8_ = tray.org.field_0._16_8_;
              auVar17._8_8_ = tray.org.field_0._40_8_;
              auVar17._0_8_ = tray.org.field_0._32_8_;
              auVar68 = vsubps_avx(auVar41,auVar15);
              auVar92._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar68._0_4_;
              auVar92._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar68._4_4_;
              auVar92._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar68._8_4_;
              auVar92._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar68._12_4_;
              uVar22 = *(undefined4 *)(root.ptr + 0x80 + lVar26 * 4);
              auVar42._4_4_ = uVar22;
              auVar42._0_4_ = uVar22;
              auVar42._8_4_ = uVar22;
              auVar42._12_4_ = uVar22;
              auVar68 = vsubps_avx(auVar42,auVar16);
              auVar101._0_4_ = tray.rdir.field_0._16_4_ * auVar68._0_4_;
              auVar101._4_4_ = tray.rdir.field_0._20_4_ * auVar68._4_4_;
              auVar101._8_4_ = tray.rdir.field_0._24_4_ * auVar68._8_4_;
              auVar101._12_4_ = tray.rdir.field_0._28_4_ * auVar68._12_4_;
              uVar22 = *(undefined4 *)(root.ptr + 0xc0 + lVar26 * 4);
              auVar43._4_4_ = uVar22;
              auVar43._0_4_ = uVar22;
              auVar43._8_4_ = uVar22;
              auVar43._12_4_ = uVar22;
              auVar68 = vsubps_avx(auVar43,auVar17);
              auVar116._0_4_ = tray.rdir.field_0._32_4_ * auVar68._0_4_;
              auVar116._4_4_ = tray.rdir.field_0._36_4_ * auVar68._4_4_;
              auVar116._8_4_ = tray.rdir.field_0._40_4_ * auVar68._8_4_;
              auVar116._12_4_ = tray.rdir.field_0._44_4_ * auVar68._12_4_;
              uVar22 = *(undefined4 *)(root.ptr + 0x60 + lVar26 * 4);
              auVar44._4_4_ = uVar22;
              auVar44._0_4_ = uVar22;
              auVar44._8_4_ = uVar22;
              auVar44._12_4_ = uVar22;
              auVar68 = vsubps_avx(auVar44,auVar15);
              auVar61._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar68._0_4_;
              auVar61._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar68._4_4_;
              auVar61._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar68._8_4_;
              auVar61._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar68._12_4_;
              uVar22 = *(undefined4 *)(root.ptr + 0xa0 + lVar26 * 4);
              auVar45._4_4_ = uVar22;
              auVar45._0_4_ = uVar22;
              auVar45._8_4_ = uVar22;
              auVar45._12_4_ = uVar22;
              auVar68 = vsubps_avx(auVar45,auVar16);
              auVar69._0_4_ = tray.rdir.field_0._16_4_ * auVar68._0_4_;
              auVar69._4_4_ = tray.rdir.field_0._20_4_ * auVar68._4_4_;
              auVar69._8_4_ = tray.rdir.field_0._24_4_ * auVar68._8_4_;
              auVar69._12_4_ = tray.rdir.field_0._28_4_ * auVar68._12_4_;
              uVar22 = *(undefined4 *)(root.ptr + 0xe0 + lVar26 * 4);
              auVar46._4_4_ = uVar22;
              auVar46._0_4_ = uVar22;
              auVar46._8_4_ = uVar22;
              auVar46._12_4_ = uVar22;
              auVar68 = vsubps_avx(auVar46,auVar17);
              auVar77._0_4_ = tray.rdir.field_0._32_4_ * auVar68._0_4_;
              auVar77._4_4_ = tray.rdir.field_0._36_4_ * auVar68._4_4_;
              auVar77._8_4_ = tray.rdir.field_0._40_4_ * auVar68._8_4_;
              auVar77._12_4_ = tray.rdir.field_0._44_4_ * auVar68._12_4_;
              auVar68 = vpminsd_avx(auVar92,auVar61);
              auVar76 = vpminsd_avx(auVar101,auVar69);
              auVar68 = vpmaxsd_avx(auVar68,auVar76);
              auVar76 = vpminsd_avx(auVar116,auVar77);
              auVar76 = vpmaxsd_avx(auVar68,auVar76);
              auVar68 = vpmaxsd_avx(auVar92,auVar61);
              auVar60 = vpmaxsd_avx(auVar101,auVar69);
              auVar60 = vpminsd_avx(auVar68,auVar60);
              auVar68 = vpmaxsd_avx(auVar116,auVar77);
              auVar60 = vpminsd_avx(auVar60,auVar68);
              auVar68 = vpmaxsd_avx(auVar76,(undefined1  [16])tray.tnear.field_0);
              auVar60 = vpminsd_avx(auVar60,(undefined1  [16])tray.tfar.field_0);
              auVar68 = vcmpps_avx(auVar68,auVar60,2);
              if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar68[0xf]) {
                auVar57 = ZEXT1664(auVar47);
                sVar28 = sVar29;
              }
              else {
                auVar68 = vblendvps_avx(auVar127._0_16_,auVar76,auVar68);
                auVar57 = ZEXT1664(auVar68);
                if (sVar29 != 8) {
                  pNVar33->ptr = sVar29;
                  pNVar33 = pNVar33 + 1;
                  *(undefined1 (*) [16])paVar32->v = auVar47;
                  paVar32 = paVar32 + 1;
                }
              }
              lVar26 = lVar26 + 1;
              auVar47 = auVar57._0_16_;
              sVar29 = sVar28;
            } while (lVar26 != 8);
            if (sVar28 == 8) goto LAB_003d20b2;
            auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar57._0_16_,6);
            uVar22 = vmovmskps_avx(auVar47);
            root.ptr = sVar28;
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar22));
          pNVar33->ptr = sVar28;
          pNVar33 = pNVar33 + 1;
          *paVar32 = auVar57._0_16_;
          paVar32 = paVar32 + 1;
LAB_003d20b2:
          iVar23 = 4;
        }
        else {
          do {
            sVar29 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> sVar29 & 1) == 0; sVar29 = sVar29 + 1) {
              }
            }
            bVar34 = occluded1(This,bvh,root,sVar29,&pre,ray,&tray,context);
            if (bVar34) {
              terminated.field_0.i[sVar29] = -1;
            }
            uVar25 = uVar25 & uVar25 - 1;
          } while (uVar25 != 0);
          auVar47 = vpcmpeqd_avx(auVar129._0_16_,auVar129._0_16_);
          auVar129 = ZEXT1664(auVar47);
          auVar47 = auVar47 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar47[0xf] < '\0') {
            auVar47._8_4_ = 0xff800000;
            auVar47._0_8_ = 0xff800000ff800000;
            auVar47._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar47,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar57 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar30 < uVar21) goto LAB_003d1f20;
        }
      } while (iVar23 != 3);
LAB_003d2933:
      auVar4 = vandps_avx(auVar4,(undefined1  [16])terminated.field_0);
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      auVar4 = vmaskmovps_avx(auVar4,auVar56);
      *(undefined1 (*) [16])(ray + 0x80) = auVar4;
    }
  }
  return;
  while( true ) {
    uVar24 = uVar24 + 1;
    lVar26 = lVar26 + 0xe0;
    auVar60 = auVar68;
    if (uVar25 - 8 <= uVar24) break;
LAB_003d21a8:
    uVar27 = 0;
    auVar47 = auVar60;
    while (uVar31 = (ulong)*(uint *)(lVar26 + uVar27 * 4), uVar31 != 0xffffffff) {
      fVar5 = *(float *)(lVar26 + -0xc0 + uVar27 * 4);
      auVar78._4_4_ = fVar5;
      auVar78._0_4_ = fVar5;
      auVar78._8_4_ = fVar5;
      auVar78._12_4_ = fVar5;
      fVar7 = *(float *)(lVar26 + -0xb0 + uVar27 * 4);
      auVar35._4_4_ = fVar7;
      auVar35._0_4_ = fVar7;
      auVar35._8_4_ = fVar7;
      auVar35._12_4_ = fVar7;
      fVar9 = *(float *)(lVar26 + -0xa0 + uVar27 * 4);
      auVar70._4_4_ = fVar9;
      auVar70._0_4_ = fVar9;
      auVar70._8_4_ = fVar9;
      auVar70._12_4_ = fVar9;
      local_36e8._4_4_ = *(float *)(lVar26 + -0x90 + uVar27 * 4);
      local_36f8._4_4_ = *(float *)(lVar26 + -0x80 + uVar27 * 4);
      local_3708._4_4_ = *(float *)(lVar26 + -0x70 + uVar27 * 4);
      fVar11 = *(float *)(lVar26 + -0x30 + uVar27 * 4);
      fVar1 = *(float *)(lVar26 + -0x20 + uVar27 * 4);
      fVar2 = *(float *)(lVar26 + -0x10 + uVar27 * 4);
      local_36e8._0_4_ = local_36e8._4_4_;
      fStack_36e0 = (float)local_36e8._4_4_;
      fStack_36dc = (float)local_36e8._4_4_;
      fVar13 = fVar5 - (float)local_36e8._4_4_;
      local_36f8._0_4_ = local_36f8._4_4_;
      fStack_36f0 = (float)local_36f8._4_4_;
      fStack_36ec = (float)local_36f8._4_4_;
      fVar14 = fVar7 - (float)local_36f8._4_4_;
      local_3708._0_4_ = local_3708._4_4_;
      fStack_3700 = (float)local_3708._4_4_;
      fStack_36fc = (float)local_3708._4_4_;
      fVar59 = fVar9 - (float)local_3708._4_4_;
      fVar7 = fVar1 - fVar7;
      fVar9 = fVar2 - fVar9;
      fVar5 = fVar11 - fVar5;
      auVar68 = vsubps_avx(auVar35,*(undefined1 (*) [16])(ray + 0x10));
      auVar76 = vsubps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x20));
      local_3668 = (float)*(undefined8 *)(ray + 0x50);
      fStack_3664 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_3660 = (float)*(undefined8 *)(ray + 0x58);
      fStack_365c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      fVar94 = auVar76._0_4_;
      auVar107._0_4_ = fVar94 * local_3668;
      fVar95 = auVar76._4_4_;
      auVar107._4_4_ = fVar95 * fStack_3664;
      fVar96 = auVar76._8_4_;
      auVar107._8_4_ = fVar96 * fStack_3660;
      fVar100 = auVar76._12_4_;
      auVar107._12_4_ = fVar100 * fStack_365c;
      local_3678 = (float)*(undefined8 *)(ray + 0x60);
      fStack_3674 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_3670 = (float)*(undefined8 *)(ray + 0x68);
      fStack_366c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar58 = auVar68._0_4_;
      auVar117._0_4_ = fVar58 * local_3678;
      fVar64 = auVar68._4_4_;
      auVar117._4_4_ = fVar64 * fStack_3674;
      fVar65 = auVar68._8_4_;
      auVar117._8_4_ = fVar65 * fStack_3670;
      fVar66 = auVar68._12_4_;
      auVar117._12_4_ = fVar66 * fStack_366c;
      auVar89 = vsubps_avx(auVar117,auVar107);
      auVar68 = vsubps_avx(auVar78,*(undefined1 (*) [16])ray);
      fVar74 = auVar68._0_4_;
      auVar108._0_4_ = fVar74 * local_3678;
      fVar79 = auVar68._4_4_;
      auVar108._4_4_ = fVar79 * fStack_3674;
      fVar80 = auVar68._8_4_;
      auVar108._8_4_ = fVar80 * fStack_3670;
      fVar81 = auVar68._12_4_;
      auVar108._12_4_ = fVar81 * fStack_366c;
      local_3688 = (float)*(undefined8 *)(ray + 0x40);
      fStack_3684 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_3680 = (float)*(undefined8 *)(ray + 0x48);
      fStack_367c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      auVar118._0_4_ = fVar94 * local_3688;
      auVar118._4_4_ = fVar95 * fStack_3684;
      auVar118._8_4_ = fVar96 * fStack_3680;
      auVar118._12_4_ = fVar100 * fStack_367c;
      auVar90 = vsubps_avx(auVar118,auVar108);
      auVar119._0_4_ = fVar58 * local_3688;
      auVar119._4_4_ = fVar64 * fStack_3684;
      auVar119._8_4_ = fVar65 * fStack_3680;
      auVar119._12_4_ = fVar66 * fStack_367c;
      auVar124._0_4_ = local_3668 * fVar74;
      auVar124._4_4_ = fStack_3664 * fVar79;
      auVar124._8_4_ = fStack_3660 * fVar80;
      auVar124._12_4_ = fStack_365c * fVar81;
      auVar91 = vsubps_avx(auVar124,auVar119);
      auVar68 = ZEXT416((uint)(fVar13 * fVar9 - fVar5 * fVar59));
      auVar76 = vshufps_avx(auVar68,auVar68,0);
      auVar68 = ZEXT416((uint)(fVar14 * fVar5 - fVar7 * fVar13));
      auVar82 = vshufps_avx(auVar68,auVar68,0);
      fVar6 = auVar76._0_4_;
      fVar8 = auVar76._4_4_;
      fVar10 = auVar76._8_4_;
      fVar12 = auVar76._12_4_;
      auVar97 = vpermilps_avx(ZEXT416((uint)(fVar7 * fVar59 - fVar14 * fVar9)),0);
      auVar125._0_4_ = auVar97._0_4_ * local_3688 + auVar82._0_4_ * local_3678 + local_3668 * fVar6;
      auVar125._4_4_ =
           auVar97._4_4_ * fStack_3684 + auVar82._4_4_ * fStack_3674 + fStack_3664 * fVar8;
      auVar125._8_4_ =
           auVar97._8_4_ * fStack_3680 + auVar82._8_4_ * fStack_3670 + fStack_3660 * fVar10;
      auVar125._12_4_ =
           auVar97._12_4_ * fStack_367c + auVar82._12_4_ * fStack_366c + fStack_365c * fVar12;
      auVar75 = vshufps_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),0);
      auVar67 = vshufps_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),0);
      auVar83 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar84._8_4_ = 0x80000000;
      auVar84._0_8_ = 0x8000000080000000;
      auVar84._12_4_ = 0x80000000;
      auVar68 = vandps_avx(auVar125,auVar84);
      uVar21 = auVar68._0_4_;
      auVar130._0_4_ =
           uVar21 ^ (uint)(auVar83._0_4_ * auVar89._0_4_ +
                          auVar90._0_4_ * auVar75._0_4_ + auVar91._0_4_ * auVar67._0_4_);
      uVar86 = auVar68._4_4_;
      auVar130._4_4_ =
           uVar86 ^ (uint)(auVar83._4_4_ * auVar89._4_4_ +
                          auVar90._4_4_ * auVar75._4_4_ + auVar91._4_4_ * auVar67._4_4_);
      uVar87 = auVar68._8_4_;
      auVar130._8_4_ =
           uVar87 ^ (uint)(auVar83._8_4_ * auVar89._8_4_ +
                          auVar90._8_4_ * auVar75._8_4_ + auVar91._8_4_ * auVar67._8_4_);
      uVar88 = auVar68._12_4_;
      auVar130._12_4_ =
           uVar88 ^ (uint)(auVar83._12_4_ * auVar89._12_4_ +
                          auVar90._12_4_ * auVar75._12_4_ + auVar91._12_4_ * auVar67._12_4_);
      auVar68 = vcmpps_avx(auVar130,_DAT_01f7aa10,5);
      auVar75 = auVar47 & auVar68;
      local_3698 = (float)*(undefined8 *)(ray + 0x30);
      fStack_3694 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_3690 = (float)*(undefined8 *)(ray + 0x38);
      fStack_368c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_36a8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_36a4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_36a0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_369c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf])
      {
LAB_003d2377:
        auVar68 = vpcmpeqd_avx(auVar76,auVar76);
      }
      else {
        auVar75 = vpermilps_avx(ZEXT416((uint)fVar13),0);
        auVar67 = vpermilps_avx(ZEXT416((uint)fVar14),0);
        auVar76 = vpermilps_avx(ZEXT416((uint)fVar59),0);
        auVar68 = vandps_avx(auVar68,auVar47);
        auVar114._0_4_ =
             uVar21 ^ (uint)(auVar75._0_4_ * auVar89._0_4_ +
                            auVar76._0_4_ * auVar91._0_4_ + auVar90._0_4_ * auVar67._0_4_);
        auVar114._4_4_ =
             uVar86 ^ (uint)(auVar75._4_4_ * auVar89._4_4_ +
                            auVar76._4_4_ * auVar91._4_4_ + auVar90._4_4_ * auVar67._4_4_);
        auVar114._8_4_ =
             uVar87 ^ (uint)(auVar75._8_4_ * auVar89._8_4_ +
                            auVar76._8_4_ * auVar91._8_4_ + auVar90._8_4_ * auVar67._8_4_);
        auVar114._12_4_ =
             uVar88 ^ (uint)(auVar75._12_4_ * auVar89._12_4_ +
                            auVar76._12_4_ * auVar91._12_4_ + auVar90._12_4_ * auVar67._12_4_);
        auVar75 = vcmpps_avx(auVar114,_DAT_01f7aa10,5);
        auVar67 = auVar68 & auVar75;
        if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar67[0xf]
           ) goto LAB_003d2377;
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar67 = vandps_avx(auVar125,auVar50);
        auVar68 = vandps_avx(auVar75,auVar68);
        auVar75 = vsubps_avx(auVar67,auVar130);
        auVar75 = vcmpps_avx(auVar75,auVar114,5);
        auVar83 = auVar68 & auVar75;
        if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar83 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar83[0xf]
           ) goto LAB_003d2377;
        auVar68 = vandps_avx(auVar75,auVar68);
        auVar37._0_4_ =
             uVar21 ^ (uint)(auVar97._0_4_ * fVar74 + fVar94 * auVar82._0_4_ + fVar58 * fVar6);
        auVar37._4_4_ =
             uVar86 ^ (uint)(auVar97._4_4_ * fVar79 + fVar95 * auVar82._4_4_ + fVar64 * fVar8);
        auVar37._8_4_ =
             uVar87 ^ (uint)(auVar97._8_4_ * fVar80 + fVar96 * auVar82._8_4_ + fVar65 * fVar10);
        auVar37._12_4_ =
             uVar88 ^ (uint)(auVar97._12_4_ * fVar81 + fVar100 * auVar82._12_4_ + fVar66 * fVar12);
        auVar73._0_4_ = auVar67._0_4_ * local_3698;
        auVar73._4_4_ = auVar67._4_4_ * fStack_3694;
        auVar73._8_4_ = auVar67._8_4_ * fStack_3690;
        auVar73._12_4_ = auVar67._12_4_ * fStack_368c;
        auVar82 = vcmpps_avx(auVar73,auVar37,1);
        auVar51._0_4_ = auVar67._0_4_ * local_36a8;
        auVar51._4_4_ = auVar67._4_4_ * fStack_36a4;
        auVar51._8_4_ = auVar67._8_4_ * fStack_36a0;
        auVar51._12_4_ = auVar67._12_4_ * fStack_369c;
        auVar75 = vcmpps_avx(auVar37,auVar51,2);
        auVar82 = vandps_avx(auVar75,auVar82);
        auVar75 = auVar68 & auVar82;
        if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar75[0xf] < '\0') {
          auVar68 = vandps_avx(auVar82,auVar68);
          auVar82 = vcmpps_avx(auVar125,_DAT_01f7aa10,4);
          auVar75 = auVar68 & auVar82;
          if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar75[0xf] < '\0') {
            auVar68 = vandps_avx(auVar82,auVar68);
            uVar21 = ((context->scene->geometries).items[uVar31].ptr)->mask;
            auVar52._4_4_ = uVar21;
            auVar52._0_4_ = uVar21;
            auVar52._8_4_ = uVar21;
            auVar52._12_4_ = uVar21;
            auVar82 = vandps_avx(auVar52,*(undefined1 (*) [16])(ray + 0x90));
            auVar82 = vpcmpeqd_avx(auVar82,_DAT_01f7aa10);
            auVar75 = auVar68 & ~auVar82;
            if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar75[0xf] < '\0') {
              auVar68 = vandnps_avx(auVar82,auVar68);
              auVar47 = vandnps_avx(auVar68,auVar47);
              goto LAB_003d2377;
            }
          }
        }
        auVar68 = vpcmpeqd_avx(auVar76,auVar76);
      }
      auVar129 = ZEXT1664(auVar68);
      if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf])
      {
        auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      uVar22 = *(undefined4 *)(lVar26 + -0x60 + uVar27 * 4);
      auVar62._4_4_ = uVar22;
      auVar62._0_4_ = uVar22;
      auVar62._8_4_ = uVar22;
      auVar62._12_4_ = uVar22;
      uVar22 = *(undefined4 *)(lVar26 + -0x50 + uVar27 * 4);
      auVar85._4_4_ = uVar22;
      auVar85._0_4_ = uVar22;
      auVar85._8_4_ = uVar22;
      auVar85._12_4_ = uVar22;
      uVar22 = *(undefined4 *)(lVar26 + -0x40 + uVar27 * 4);
      auVar93._4_4_ = uVar22;
      auVar93._0_4_ = uVar22;
      auVar93._8_4_ = uVar22;
      auVar93._12_4_ = uVar22;
      auVar20._4_4_ = fVar11;
      auVar20._0_4_ = fVar11;
      auVar20._8_4_ = fVar11;
      auVar20._12_4_ = fVar11;
      auVar68 = vsubps_avx(auVar62,auVar20);
      auVar19._4_4_ = fVar1;
      auVar19._0_4_ = fVar1;
      auVar19._8_4_ = fVar1;
      auVar19._12_4_ = fVar1;
      auVar76 = vsubps_avx(auVar85,auVar19);
      auVar18._4_4_ = fVar2;
      auVar18._0_4_ = fVar2;
      auVar18._8_4_ = fVar2;
      auVar18._12_4_ = fVar2;
      auVar82 = vsubps_avx(auVar93,auVar18);
      auVar75 = vsubps_avx(_local_36e8,auVar62);
      auVar67 = vsubps_avx(_local_36f8,auVar85);
      auVar83 = vsubps_avx(_local_3708,auVar93);
      fVar5 = auVar76._0_4_;
      fVar132 = auVar83._0_4_;
      auVar36._0_4_ = fVar132 * fVar5;
      fVar11 = auVar76._4_4_;
      fVar133 = auVar83._4_4_;
      auVar36._4_4_ = fVar133 * fVar11;
      fVar6 = auVar76._8_4_;
      fVar134 = auVar83._8_4_;
      auVar36._8_4_ = fVar134 * fVar6;
      fVar12 = auVar76._12_4_;
      fVar135 = auVar83._12_4_;
      auVar36._12_4_ = fVar135 * fVar12;
      fVar7 = auVar82._0_4_;
      fVar115 = auVar67._0_4_;
      auVar48._0_4_ = fVar115 * fVar7;
      fVar1 = auVar82._4_4_;
      fVar121 = auVar67._4_4_;
      auVar48._4_4_ = fVar121 * fVar1;
      fVar8 = auVar82._8_4_;
      fVar122 = auVar67._8_4_;
      auVar48._8_4_ = fVar122 * fVar8;
      fVar13 = auVar82._12_4_;
      fVar123 = auVar67._12_4_;
      auVar48._12_4_ = fVar123 * fVar13;
      auVar76 = vsubps_avx(auVar48,auVar36);
      fVar100 = auVar75._0_4_;
      auVar49._0_4_ = fVar100 * fVar7;
      fVar103 = auVar75._4_4_;
      auVar49._4_4_ = fVar103 * fVar1;
      fVar104 = auVar75._8_4_;
      auVar49._8_4_ = fVar104 * fVar8;
      fVar105 = auVar75._12_4_;
      auVar49._12_4_ = fVar105 * fVar13;
      fVar9 = auVar68._0_4_;
      auVar71._0_4_ = fVar132 * fVar9;
      fVar2 = auVar68._4_4_;
      auVar71._4_4_ = fVar133 * fVar2;
      fVar10 = auVar68._8_4_;
      auVar71._8_4_ = fVar134 * fVar10;
      fVar14 = auVar68._12_4_;
      auVar71._12_4_ = fVar135 * fVar14;
      auVar82 = vsubps_avx(auVar71,auVar49);
      auVar72._0_4_ = fVar115 * fVar9;
      auVar72._4_4_ = fVar121 * fVar2;
      auVar72._8_4_ = fVar122 * fVar10;
      auVar72._12_4_ = fVar123 * fVar14;
      auVar109._0_4_ = fVar100 * fVar5;
      auVar109._4_4_ = fVar103 * fVar11;
      auVar109._8_4_ = fVar104 * fVar6;
      auVar109._12_4_ = fVar105 * fVar12;
      auVar75 = vsubps_avx(auVar109,auVar72);
      auVar68 = vsubps_avx(auVar62,*(undefined1 (*) [16])ray);
      auVar67 = vsubps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x10));
      auVar83 = vsubps_avx(auVar93,*(undefined1 (*) [16])(ray + 0x20));
      fVar81 = auVar83._0_4_;
      auVar110._0_4_ = fVar81 * local_3668;
      fVar94 = auVar83._4_4_;
      auVar110._4_4_ = fVar94 * fStack_3664;
      fVar95 = auVar83._8_4_;
      auVar110._8_4_ = fVar95 * fStack_3660;
      fVar96 = auVar83._12_4_;
      auVar110._12_4_ = fVar96 * fStack_365c;
      fVar66 = auVar67._0_4_;
      auVar126._0_4_ = fVar66 * local_3678;
      fVar74 = auVar67._4_4_;
      auVar126._4_4_ = fVar74 * fStack_3674;
      fVar79 = auVar67._8_4_;
      auVar126._8_4_ = fVar79 * fStack_3670;
      fVar80 = auVar67._12_4_;
      auVar126._12_4_ = fVar80 * fStack_366c;
      auVar67 = vsubps_avx(auVar126,auVar110);
      fVar59 = auVar68._0_4_;
      auVar111._0_4_ = fVar59 * local_3678;
      fVar58 = auVar68._4_4_;
      auVar111._4_4_ = fVar58 * fStack_3674;
      fVar64 = auVar68._8_4_;
      auVar111._8_4_ = fVar64 * fStack_3670;
      fVar65 = auVar68._12_4_;
      auVar111._12_4_ = fVar65 * fStack_366c;
      auVar128._0_4_ = fVar81 * local_3688;
      auVar128._4_4_ = fVar94 * fStack_3684;
      auVar128._8_4_ = fVar95 * fStack_3680;
      auVar128._12_4_ = fVar96 * fStack_367c;
      auVar83 = vsubps_avx(auVar128,auVar111);
      auVar112._0_4_ = fVar66 * local_3688;
      auVar112._4_4_ = fVar74 * fStack_3684;
      auVar112._8_4_ = fVar79 * fStack_3680;
      auVar112._12_4_ = fVar80 * fStack_367c;
      auVar131._0_4_ = fVar59 * local_3668;
      auVar131._4_4_ = fVar58 * fStack_3664;
      auVar131._8_4_ = fVar64 * fStack_3660;
      auVar131._12_4_ = fVar65 * fStack_365c;
      auVar89 = vsubps_avx(auVar131,auVar112);
      auVar113._0_4_ =
           auVar76._0_4_ * local_3688 + auVar75._0_4_ * local_3678 + auVar82._0_4_ * local_3668;
      auVar113._4_4_ =
           auVar76._4_4_ * fStack_3684 + auVar75._4_4_ * fStack_3674 + auVar82._4_4_ * fStack_3664;
      auVar113._8_4_ =
           auVar76._8_4_ * fStack_3680 + auVar75._8_4_ * fStack_3670 + auVar82._8_4_ * fStack_3660;
      auVar113._12_4_ =
           auVar76._12_4_ * fStack_367c +
           auVar75._12_4_ * fStack_366c + auVar82._12_4_ * fStack_365c;
      auVar120._8_4_ = 0x80000000;
      auVar120._0_8_ = 0x8000000080000000;
      auVar120._12_4_ = 0x80000000;
      auVar68 = vandps_avx(auVar113,auVar120);
      uVar21 = auVar68._0_4_;
      auVar102._0_4_ =
           uVar21 ^ (uint)(fVar100 * auVar67._0_4_ +
                          fVar115 * auVar83._0_4_ + fVar132 * auVar89._0_4_);
      uVar86 = auVar68._4_4_;
      auVar102._4_4_ =
           uVar86 ^ (uint)(fVar103 * auVar67._4_4_ +
                          fVar121 * auVar83._4_4_ + fVar133 * auVar89._4_4_);
      uVar87 = auVar68._8_4_;
      auVar102._8_4_ =
           uVar87 ^ (uint)(fVar104 * auVar67._8_4_ +
                          fVar122 * auVar83._8_4_ + fVar134 * auVar89._8_4_);
      uVar88 = auVar68._12_4_;
      auVar102._12_4_ =
           uVar88 ^ (uint)(fVar105 * auVar67._12_4_ +
                          fVar123 * auVar83._12_4_ + fVar135 * auVar89._12_4_);
      auVar68 = vcmpps_avx(auVar102,_DAT_01f7aa10,5);
      auVar90 = auVar47 & auVar68;
      if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
      {
        auVar68 = vpcmpeqd_avx(auVar83,auVar83);
        auVar129 = ZEXT1664(auVar68);
LAB_003d24ea:
        auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      }
      else {
        auVar68 = vandps_avx(auVar68,auVar47);
        auVar99._0_4_ =
             uVar21 ^ (uint)(auVar67._0_4_ * fVar9 + auVar83._0_4_ * fVar5 + auVar89._0_4_ * fVar7);
        auVar99._4_4_ =
             uVar86 ^ (uint)(auVar67._4_4_ * fVar2 + auVar83._4_4_ * fVar11 + auVar89._4_4_ * fVar1)
        ;
        auVar99._8_4_ =
             uVar87 ^ (uint)(auVar67._8_4_ * fVar10 + auVar83._8_4_ * fVar6 + auVar89._8_4_ * fVar8)
        ;
        auVar99._12_4_ =
             uVar88 ^ (uint)(auVar67._12_4_ * fVar14 +
                            auVar83._12_4_ * fVar12 + auVar89._12_4_ * fVar13);
        auVar67 = vcmpps_avx(auVar99,_DAT_01f7aa10,5);
        auVar89 = auVar68 & auVar67;
        if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar89 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar89 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar89[0xf]
           ) {
          auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar68 = vpcmpeqd_avx(auVar83,auVar83);
          auVar129 = ZEXT1664(auVar68);
        }
        else {
          auVar38._8_4_ = 0x7fffffff;
          auVar38._0_8_ = 0x7fffffff7fffffff;
          auVar38._12_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar113,auVar38);
          auVar68 = vandps_avx(auVar67,auVar68);
          auVar67 = vsubps_avx(auVar89,auVar102);
          auVar67 = vcmpps_avx(auVar67,auVar99,5);
          auVar90 = auVar68 & auVar67;
          auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar83 = vpcmpeqd_avx(auVar83,auVar83);
          auVar129 = ZEXT1664(auVar83);
          if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar90[0xf] < '\0') {
            auVar68 = vandps_avx(auVar68,auVar67);
            auVar39._0_4_ =
                 uVar21 ^ (uint)(fVar59 * auVar76._0_4_ +
                                fVar81 * auVar75._0_4_ + fVar66 * auVar82._0_4_);
            auVar39._4_4_ =
                 uVar86 ^ (uint)(fVar58 * auVar76._4_4_ +
                                fVar94 * auVar75._4_4_ + fVar74 * auVar82._4_4_);
            auVar39._8_4_ =
                 uVar87 ^ (uint)(fVar64 * auVar76._8_4_ +
                                fVar95 * auVar75._8_4_ + fVar79 * auVar82._8_4_);
            auVar39._12_4_ =
                 uVar88 ^ (uint)(fVar65 * auVar76._12_4_ +
                                fVar96 * auVar75._12_4_ + fVar80 * auVar82._12_4_);
            auVar53._0_4_ = auVar89._0_4_ * local_3698;
            auVar53._4_4_ = auVar89._4_4_ * fStack_3694;
            auVar53._8_4_ = auVar89._8_4_ * fStack_3690;
            auVar53._12_4_ = auVar89._12_4_ * fStack_368c;
            auVar76 = vcmpps_avx(auVar53,auVar39,1);
            auVar63._0_4_ = auVar89._0_4_ * local_36a8;
            auVar63._4_4_ = auVar89._4_4_ * fStack_36a4;
            auVar63._8_4_ = auVar89._8_4_ * fStack_36a0;
            auVar63._12_4_ = auVar89._12_4_ * fStack_369c;
            auVar82 = vcmpps_avx(auVar39,auVar63,2);
            auVar76 = vandps_avx(auVar82,auVar76);
            auVar82 = auVar68 & auVar76;
            if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar82[0xf] < '\0') {
              auVar68 = vandps_avx(auVar76,auVar68);
              auVar76 = vcmpps_avx(auVar113,_DAT_01f7aa10,4);
              auVar82 = auVar68 & auVar76;
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar82[0xf] < '\0') {
                auVar68 = vandps_avx(auVar76,auVar68);
                uVar21 = ((context->scene->geometries).items[uVar31].ptr)->mask;
                auVar54._4_4_ = uVar21;
                auVar54._0_4_ = uVar21;
                auVar54._8_4_ = uVar21;
                auVar54._12_4_ = uVar21;
                auVar76 = vandps_avx(auVar54,*(undefined1 (*) [16])(ray + 0x90));
                auVar76 = vpcmpeqd_avx(auVar76,_DAT_01f7aa10);
                auVar82 = auVar68 & ~auVar76;
                if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar82[0xf] < '\0') {
                  auVar68 = vandnps_avx(auVar76,auVar68);
                  auVar47 = vandnps_avx(auVar68,auVar47);
                  goto LAB_003d24ea;
                }
              }
            }
            auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
        }
      }
      if (((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf])
         || (bVar34 = 2 < uVar27, uVar27 = uVar27 + 1, bVar34)) break;
    }
    auVar68 = vandps_avx(auVar47,auVar60);
    auVar60 = auVar60 & auVar47;
    if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
    break;
  }
  aVar40._0_4_ = auVar129._0_4_ ^ auVar68._0_4_;
  aVar40._4_4_ = auVar129._4_4_ ^ auVar68._4_4_;
  aVar40._8_4_ = auVar129._8_4_ ^ auVar68._8_4_;
  aVar40._12_4_ = auVar129._12_4_ ^ auVar68._12_4_;
LAB_003d2808:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar40);
  auVar47 = auVar129._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf])
  goto LAB_003d2933;
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar55,
                     (undefined1  [16])terminated.field_0);
  goto LAB_003d1ee2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }